

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

string * webfront::websocket::getHashedSecKey(string *__return_storage_ptr__,string *key)

{
  array<unsigned_int,_5UL> input;
  char *in_RCX;
  string_view input_00;
  array<unsigned_int,_5UL> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,key,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
  input_00._M_str = in_RCX;
  input_00._M_len = (size_t)local_30._M_dataplus._M_p;
  crypto::sha1(&local_48,(crypto *)local_30._M_string_length,input_00);
  input._M_elems[2] = local_48._M_elems[2];
  input._M_elems[3] = local_48._M_elems[3];
  input._M_elems[0] = local_48._M_elems[0];
  input._M_elems[1] = local_48._M_elems[1];
  input._M_elems[4] = local_48._M_elems[4];
  base64::encodeInNetworkOrder<std::array<unsigned_int,_5UL>_>(input);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline std::string getHashedSecKey(std::string key) {
    constexpr auto rfc6455Guid = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    return base64::encodeInNetworkOrder(crypto::sha1(key + rfc6455Guid));
}